

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset_function.cc
# Opt level: O0

MatrixXd * __thiscall
projects::ipdg_stokes::assemble::PiecewiseBoundaryNormalJumpAssembler::Eval
          (MatrixXd *__return_storage_ptr__,PiecewiseBoundaryNormalJumpAssembler *this,
          Entity *entity)

{
  Index *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference ppEVar3;
  undefined4 extraout_var_03;
  int *piVar4;
  reference ppEVar5;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Scalar *pSVar6;
  Scalar SVar7;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar8;
  ColXpr local_3f8;
  ConstColXpr local_3c0;
  ConstTransposeReturnType local_390;
  Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
  local_360;
  element_type local_2f8;
  Entity *edge_1;
  element_type pEStack_2e8;
  int edge_idx;
  Entity *node_1;
  int local_2d8;
  int row_idx;
  int node_idx;
  int col_idx;
  ConstantReturnType local_2c8;
  undefined1 local_2a9;
  Entity *local_2a8;
  Entity *edge;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_1;
  Entity *node;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  int boundary_edge_count;
  int boundary_node_count;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> edges;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> nodes;
  NegativeReturnType local_208;
  ConstRowXpr local_1c8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_190;
  int local_170 [2];
  undefined1 local_168 [8];
  MatrixXd basis_funct;
  undefined1 local_140 [8];
  MatrixXd grads;
  Matrix<double,__1,__1,_0,__1,__1> local_110;
  undefined1 local_f8 [8];
  MatrixXd J_inv_trans;
  ConstantReturnType local_d0;
  Matrix<double,__1,__1,_0,__1,__1> local_b8;
  Matrix<double,__1,__1,_0,__1,__1> local_a0;
  non_const_type local_88;
  undefined1 local_80 [8];
  MatrixXd ref_grads;
  FeLagrangeO1Tria<double> hat_func;
  Geometry *geom;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  Entity *entity_local;
  PiecewiseBoundaryNormalJumpAssembler *this_local;
  MatrixXd *elem_mat;
  
  ipdg_stokes::mesh::computeOutwardNormals((Matrix<double,_2,_3,_0,_2,_3> *)&geom,entity);
  iVar2 = (*entity->_vptr_Entity[3])();
  this_00 = &ref_grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
  lf::uscalfe::FeLagrangeO1Tria<double>::FeLagrangeO1Tria((FeLagrangeO1Tria<double> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_d0,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_b8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_d0);
  lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
            (&local_a0,(FeLagrangeO1Tria<double> *)this_00,(MatrixXd *)&local_b8);
  local_88 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_a0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_80,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_88);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_b8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_110,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))
            (local_f8,(long *)CONCAT44(extraout_var,iVar2),&local_110);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_110);
  PVar8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f8,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80);
  basis_funct.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)PVar8.m_lhs;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_140,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&basis_funct.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols);
  local_170[1] = 2;
  local_170[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_168,local_170 + 1,local_170);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_1c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140,1);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
            (&local_190,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_168,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_1c8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((ConstRowXpr *)&nodes._M_extent,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140,0);
  Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
  operator-(&local_208,
            (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
             *)&nodes._M_extent);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_190,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_208);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_190);
  iVar2 = (*entity->_vptr_Entity[1])(entity,2);
  edges._M_extent._M_extent_value = CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*entity->_vptr_Entity[1])(entity,1);
  _boundary_edge_count = (pointer)CONCAT44(extraout_var_01,iVar2);
  __range2._4_4_ = 0;
  __range2._0_4_ = 0;
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                      &edges._M_extent);
  node = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&edges._M_extent)
  ;
  while (bVar1 = __gnu_cxx::
                 operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                           (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     *)&node), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    iVar2 = (**this->boundary_->_vptr_MeshDataSet)(this->boundary_,*ppEVar3);
    if ((*(byte *)CONCAT44(extraout_var_02,iVar2) & 1) != 0) {
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                        &boundary_edge_count);
  edge = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                    &boundary_edge_count);
  while (bVar1 = __gnu_cxx::
                 operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                           (&__end2_1,
                            (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             *)&edge), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2_1);
    local_2a8 = *ppEVar3;
    iVar2 = (**this->boundary_->_vptr_MeshDataSet)(this->boundary_,local_2a8);
    if ((*(byte *)CONCAT44(extraout_var_03,iVar2) & 1) != 0) {
      __range2._0_4_ = (int)__range2 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2_1);
  }
  local_2a9 = 0;
  col_idx = 1;
  piVar4 = std::max<int>(&col_idx,(int *)&__range2);
  iVar2 = *piVar4;
  node_idx = 1;
  piVar4 = std::max<int>(&node_idx,(int *)((long)&__range2 + 4));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (&local_2c8,(long)iVar2,(long)*piVar4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2c8);
  row_idx = 0;
  for (local_2d8 = 0; local_2d8 < 3; local_2d8 = local_2d8 + 1) {
    node_1._4_4_ = 0;
    ppEVar5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                         &edges._M_extent,(long)local_2d8);
    pEStack_2e8 = *ppEVar5;
    iVar2 = (**this->boundary_->_vptr_MeshDataSet)(this->boundary_,pEStack_2e8);
    if ((*(byte *)CONCAT44(extraout_var_04,iVar2) & 1) != 0) {
      for (edge_1._4_4_ = 0; edge_1._4_4_ < 3; edge_1._4_4_ = edge_1._4_4_ + 1) {
        ppEVar5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                            ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                             &boundary_edge_count,(long)edge_1._4_4_);
        local_2f8 = *ppEVar5;
        iVar2 = (**this->boundary_->_vptr_MeshDataSet)(this->boundary_,local_2f8);
        if ((*(byte *)CONCAT44(extraout_var_05,iVar2) & 1) != 0) {
          Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::col
                    (&local_3c0,(DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)&geom,
                     (long)edge_1._4_4_);
          Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>::
          transpose(&local_390,
                    (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>_>
                     *)&local_3c0);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                    (&local_3f8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_168,
                     (long)local_2d8);
          Eigen::
          MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>const,2,1,true>const>>
          ::operator*(&local_360,
                      (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,3,0,2,3>const,2,1,true>const>>
                       *)&local_390,
                      (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)&local_3f8);
          SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                            ((dense_product_base *)&local_360);
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                              __return_storage_ptr__,(long)node_1._4_4_,(long)row_idx);
          *pSVar6 = SVar7;
          node_1._4_4_ = node_1._4_4_ + 1;
        }
      }
      row_idx = row_idx + 1;
    }
  }
  local_2a9 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_168);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_140);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_f8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd PiecewiseBoundaryNormalJumpAssembler::Eval(
    const lf::mesh::Entity &entity) const {
  // Use the vertex coordinates to compute the local normals on the edges
  const Eigen::Matrix<double, 2, 3> normals =
      projects::ipdg_stokes::mesh::computeOutwardNormals(entity);
  // Construct the basis functions from the curl of the standard hat functions
  const auto *geom = entity.Geometry();
  const lf::uscalfe::FeLagrangeO1Tria<double> hat_func;
  const Eigen::MatrixXd ref_grads =
      hat_func.GradientsReferenceShapeFunctions(Eigen::VectorXd::Zero(2))
          .transpose();
  const Eigen::MatrixXd J_inv_trans =
      geom->JacobianInverseGramian(Eigen::VectorXd::Zero(2));
  const Eigen::MatrixXd grads = J_inv_trans * ref_grads;
  Eigen::MatrixXd basis_funct(2, 3);
  basis_funct << grads.row(1), -grads.row(0);
  const auto nodes = entity.SubEntities(2);
  const auto edges = entity.SubEntities(1);
  // Count the number of boundary nodes and edges belonging to this triangle
  // to get the size of the element matrix
  int boundary_node_count = 0;
  int boundary_edge_count = 0;
  for (const auto *const node : nodes) {
    if (boundary_(*node)) {
      ++boundary_node_count;
    }
  }
  for (const auto *const edge : edges) {
    if (boundary_(*edge)) {
      ++boundary_edge_count;
    }
  }
  // Assemble the element matrix itself
  Eigen::MatrixXd elem_mat = Eigen::MatrixXd::Zero(
      std::max(1, boundary_edge_count), std::max(1, boundary_node_count));
  int col_idx = 0;
  for (int node_idx = 0; node_idx < 3; ++node_idx) {
    int row_idx = 0;
    const auto &node = *nodes[node_idx];
    if (boundary_(node)) {
      for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
        const auto &edge = *edges[edge_idx];
        if (boundary_(edge)) {
          elem_mat(row_idx, col_idx) =
              normals.col(edge_idx).transpose() * basis_funct.col(node_idx);
          ++row_idx;
        }
      }
      ++col_idx;
    }
  }
  return elem_mat;
}